

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

string * __thiscall HTTPRequest::str_abi_cxx11_(string *__return_storage_ptr__,HTTPRequest *this)

{
  _Rb_tree_node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  HTTPRequest *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,&this->method," ");
  std::operator+(&local_90,&local_50,&this->uri);
  std::operator+(&local_70,&local_90," ");
  std::operator+(&local_b8,&local_70,&this->version);
  std::operator+(__return_storage_ptr__,&local_b8,"\n");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  local_98 = this;
  for (p_Var1 = (this->header)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->header)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                   ,": ");
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 2)
                  );
    std::operator+(&local_b8,&local_70,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (0 < local_98->content_length) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,local_98->content,local_98->content + local_98->content_length);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HTTPRequest::str() {
    auto result = this->method + " " + this->uri + " " + this->version + "\n";
    for (auto && i : this->header) {
        result += std::get<0>(i) + ": " + std::get<1>(i) + "\n";
    }
    if (this->content_length > 0) {
        result += std::string(this->content, this->content_length * sizeof(char));
    }
    return result;
}